

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::solveLleft(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  pointer pdVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = (ulong)(uint)this->thedim;
  piVar4 = (this->l).rorig;
  piVar5 = (this->l).rbeg;
  while (0 < (int)uVar8) {
    lVar9 = (long)piVar4[uVar8 - 1];
    uVar8 = uVar8 - 1;
    dVar1 = vec[lVar9];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar2 = piVar5[lVar9 + 1];
      pdVar6 = (this->l).rval.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->l).ridx;
      for (lVar9 = (long)piVar5[lVar9]; lVar9 < iVar2; lVar9 = lVar9 + 1) {
        iVar3 = piVar7[lVar9];
        vec[iVar3] = vec[iVar3] - pdVar6[lVar9] * dVar1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}